

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O3

int qc_staticlist_add_at(QcStaticList *staticList,int previous_cell,int cell)

{
  long lVar1;
  int iVar2;
  char *buff;
  int *piVar3;
  
  iVar2 = -1;
  if ((((-1 < previous_cell && staticList != (QcStaticList *)0x0) &&
       (previous_cell < staticList->limit)) && (cell < staticList->limit && -1 < cell)) &&
     (iVar2 = -99, staticList->head != -99)) {
    lVar1 = staticList->buff_offset;
    iVar2 = *(int *)((long)&staticList->tail + (ulong)(uint)previous_cell * 8 + lVar1);
    piVar3 = (int *)((long)&staticList->head + (long)iVar2 * 8 + lVar1);
    if ((long)iVar2 == -99) {
      piVar3 = &staticList->tail;
    }
    *piVar3 = cell;
    *(int *)((long)&staticList->tail + (ulong)(uint)previous_cell * 8 + lVar1) = cell;
    *(int *)((long)&staticList->head + (ulong)(uint)cell * 8 + lVar1) = previous_cell;
    *(int *)((long)&staticList->tail + (ulong)(uint)cell * 8 + lVar1) = iVar2;
    staticList->num = staticList->num + 1;
    iVar2 = cell;
  }
  return iVar2;
}

Assistant:

int qc_staticlist_add_at(QcStaticList *staticList, int previous_cell, int cell)
{
    int next;
    _StaticCell *curCell, *preCell, *nextCell;

    if(NULL == staticList)
        return -1;

    if(previous_cell<0 || previous_cell>=staticList->limit)
        return -1;

    if(cell<0 || cell>=staticList->limit)
        return -1;

    if(staticList->head == QC_INVALID_INT)
        return QC_INVALID_INT;

    curCell = get_staticlist_cell(staticList, cell);
    preCell=get_staticlist_cell(staticList, previous_cell);
    next=preCell->next;

    if(next!= QC_INVALID_INT)
    {
       nextCell=get_staticlist_cell(staticList, next);
       preCell->next=cell;
       nextCell->previous=cell;
       curCell->previous=previous_cell;
       curCell->next=next;
    }
    else
    {
       preCell->next=cell;
       curCell->previous=previous_cell;
       curCell->next=QC_INVALID_INT;
       staticList->tail=cell;
    }
    staticList->num ++;

    return cell;
}